

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

object_validator __thiscall goodform::sub_form::object(sub_form *this)

{
  bool bVar1;
  undefined1 *puVar2;
  object_validator oVar3;
  string local_58;
  error_message local_38;
  
  bVar1 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                    (this->variant_);
  if (bVar1) {
    puVar2 = (undefined1 *)
             get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                       (this->variant_);
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"NOT AN OBJECT","");
    error_message::error_message(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)this->error_,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.message_._M_dataplus._M_p != &local_38.message_.field_2) {
      operator_delete(local_38.message_._M_dataplus._M_p,
                      local_38.message_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    puVar2 = const_object_abi_cxx11_;
  }
  oVar3.value_ = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                  *)puVar2;
  oVar3.error_ = this->error_;
  return oVar3;
}

Assistant:

object_validator sub_form::object()
  {
    if (!is<goodform::object_t>(this->variant_))
    {
      this->error_ = error_message("NOT AN OBJECT");
      return object_validator(const_object, this->error_);
    }
    else
    {
      return object_validator(get<goodform::object_t>(this->variant_), this->error_);
    }
  }